

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O3

UDate icu_63::parseDate(UChar *text,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  UErrorCode UVar4;
  int32_t dom;
  int32_t month;
  int32_t year;
  int iVar5;
  ulong uVar6;
  UDate UVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
  iVar2 = u_strlen_63(text);
  if ((iVar2 == 10) || (iVar2 == 0x10)) {
    UVar4 = *status;
    year = 0;
    if (UVar4 < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar6 = 0xffffffffffffffff;
      do {
        iVar3 = (ushort)text[uVar6 + 1] - 0x30;
        if (9 < (ushort)((ushort)text[uVar6 + 1] - 0x30)) {
          iVar3 = -1;
        }
        if (iVar3 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          dom = 0;
          UVar4 = U_INVALID_FORMAT_ERROR;
          month = -1;
          goto LAB_002907b0;
        }
        year = iVar3 + year * 10;
        uVar6 = uVar6 + 1;
      } while (uVar6 < 3);
      iVar3 = 0;
      uVar6 = 4;
      do {
        iVar5 = (ushort)text[uVar6 + 1] - 0x30;
        if (9 < (ushort)((ushort)text[uVar6 + 1] - 0x30)) {
          iVar5 = -1;
        }
        if (iVar5 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          month = iVar3 + -1;
          dom = 0;
          goto LAB_002907ab;
        }
        iVar3 = iVar5 + iVar3 * 10;
        uVar6 = uVar6 + 1;
      } while (uVar6 < 6);
      month = iVar3 + -1;
      dom = 0;
      uVar6 = 7;
LAB_0029075b:
      iVar3 = (ushort)text[uVar6 + 1] - 0x30;
      if (9 < (ushort)((ushort)text[uVar6 + 1] - 0x30)) {
        iVar3 = -1;
      }
      if (-1 < iVar3) goto code_r0x00290773;
      *status = U_INVALID_FORMAT_ERROR;
LAB_002907ab:
      UVar4 = U_INVALID_FORMAT_ERROR;
      goto LAB_002907b0;
    }
    month = -1;
    dom = 0;
LAB_002907b0:
    UVar7 = 0.0;
    if (iVar2 == 0x10) {
      if (U_ZERO_ERROR < UVar4) {
        return 0.0;
      }
      iVar3 = 0;
      uVar6 = 10;
      do {
        iVar5 = (ushort)text[uVar6 + 1] - 0x30;
        if (9 < (ushort)((ushort)text[uVar6 + 1] - 0x30)) {
          iVar5 = -1;
        }
        if (iVar5 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          return 0.0;
        }
        iVar3 = iVar5 + iVar3 * 10;
        uVar6 = uVar6 + 1;
      } while (uVar6 < 0xc);
      iVar5 = 0;
      uVar6 = 0xd;
      do {
        iVar1 = (ushort)text[uVar6 + 1] - 0x30;
        if (9 < (ushort)((ushort)text[uVar6 + 1] - 0x30)) {
          iVar1 = -1;
        }
        if (iVar1 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
          UVar4 = U_INVALID_FORMAT_ERROR;
          break;
        }
        iVar5 = iVar1 + iVar5 * 10;
        uVar6 = uVar6 + 1;
      } while (uVar6 < 0xf);
      dVar9 = (double)(iVar5 * 60000);
      dVar10 = (double)(iVar3 * 3600000);
    }
    else {
      dVar10 = 0.0;
      dVar9 = 0.0;
    }
    if (UVar4 < U_ILLEGAL_ARGUMENT_ERROR) {
      dVar8 = Grego::fieldsToDay(year,month,dom);
      UVar7 = dVar8 * 86400000.0 + dVar10 + dVar9;
    }
  }
  else {
    *status = U_INVALID_FORMAT_ERROR;
    UVar7 = 0.0;
  }
  return UVar7;
code_r0x00290773:
  dom = iVar3 + dom * 10;
  uVar6 = uVar6 + 1;
  if (8 < uVar6) goto LAB_002907b0;
  goto LAB_0029075b;
}

Assistant:

static UDate
parseDate (const UChar *text, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    int32_t len = u_strlen(text);
    if (len != 16 && len != 10) {
        // It must be yyyy-MM-dd HH:mm (length 16) or yyyy-MM-dd (length 10)
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }

    int32_t year = 0, month = 0, day = 0, hour = 0, min = 0, n;
    int32_t idx;

    // "yyyy" (0 - 3)
    for (idx = 0; idx <= 3 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            year = 10*year + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    // "MM" (5 - 6)
    for (idx = 5; idx <= 6 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            month = 10*month + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    // "dd" (8 - 9)
    for (idx = 8; idx <= 9 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            day = 10*day + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    if (len == 16) {
        // "HH" (11 - 12)
        for (idx = 11; idx <= 12 && U_SUCCESS(status); idx++) {
            n = ASCII_DIGIT((int32_t)text[idx]);
            if (n >= 0) {
                hour = 10*hour + n;
            } else {
                status = U_INVALID_FORMAT_ERROR;
            }
        }
        // "mm" (14 - 15)
        for (idx = 14; idx <= 15 && U_SUCCESS(status); idx++) {
            n = ASCII_DIGIT((int32_t)text[idx]);
            if (n >= 0) {
                min = 10*min + n;
            } else {
                status = U_INVALID_FORMAT_ERROR;
            }
        }
    }

    if (U_SUCCESS(status)) {
        UDate date = Grego::fieldsToDay(year, month - 1, day) * U_MILLIS_PER_DAY
            + hour * U_MILLIS_PER_HOUR + min * U_MILLIS_PER_MINUTE;
        return date;
    }
    return 0;
}